

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jason.c
# Opt level: O1

void StartIf(void)

{
  int iVar1;
  tokentype tokopnd;
  addressrec a;
  addressrec b;
  optype intopcode;
  
  iVar1 = actionpop();
  tokopnd = actionpop();
  a = getaddress(tokopnd);
  intopcode = opnull;
  if (iVar1 - 0x19U < 7) {
    intopcode = *(optype *)(&DAT_0010cb58 + (ulong)(iVar1 - 0x19U) * 4);
  }
  b = gettemplabel();
  nextop = genquad(intopcode,a,b,(addressrec)0x4);
  actionpush(b.opnd);
  return;
}

Assistant:

void	StartIf(void)
{
    enum tokentype		relop;
    enum optype	otype = opnull;
    struct addressrec	operand, addr1;
    relop = actionpop();
    operand = getaddress(actionpop());
    switch(relop)	{
        case tokgreater:	otype = opifnegzjump; break;
        case tokless:	otype = opifposzjump; break;
        case tokequals: otype = opifnzjump; break;
        case toknotequal:	otype = opifzjump; break;
        default: break;
    }
    addr1 = gettemplabel();
    nextop = genquad(otype, operand, addr1, no_op);
    actionpush(addr1.opnd);
    
    
}